

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# note.c
# Opt level: O1

nsync_note nsync_note_new(nsync_note parent,nsync_time abs_deadline)

{
  __time_t _Var1;
  __syscall_slong_t _Var2;
  int iVar3;
  nsync_note n;
  nsync_dll_list_ pnVar4;
  nsync_time *pnVar5;
  nsync_time nVar6;
  nsync_time a;
  
  n = (nsync_note)malloc(0x70);
  if (n == (nsync_note)0x0) {
    return (nsync_note)0x0;
  }
  n->children = (nsync_dll_element_ *)0x0;
  n->waiters = (nsync_dll_element_ *)0x0;
  n->disconnecting = 0;
  n->notified = 0;
  n->parent = (nsync_note_s_ *)0x0;
  *(undefined8 *)&n->no_children_cv = 0;
  (n->no_children_cv).waiters = (nsync_dll_element_s_ *)0x0;
  *(undefined8 *)&n->note_mu = 0;
  (n->note_mu).waiters = (nsync_dll_element_s_ *)0x0;
  (n->expiry_time).tv_sec = 0;
  (n->expiry_time).tv_nsec = 0;
  (n->parent_child_link).container = (void *)0x0;
  *(undefined8 *)&n->expiry_time_valid = 0;
  (n->parent_child_link).next = (nsync_dll_element_s_ *)0x0;
  (n->parent_child_link).prev = (nsync_dll_element_s_ *)0x0;
  nsync_dll_init_((nsync_dll_element_ *)n,n);
  (n->expiry_time).tv_sec = abs_deadline.tv_sec;
  (n->expiry_time).tv_nsec = abs_deadline.tv_nsec;
  n->expiry_time_valid = 1;
  nVar6 = nsync_note_notified_deadline_(n);
  pnVar5 = &nsync_time_zero;
  iVar3 = nsync_time_cmp(nVar6,(nsync_time)ZEXT816((ulong)0));
  if (parent != (nsync_note)0x0) {
    if (0 < iVar3) {
      nsync_mu_lock(&parent->note_mu);
      if (parent->notified == 0) {
        if (parent->expiry_time_valid == 0) {
          pnVar5 = &nsync_time_no_deadline;
        }
        else {
          pnVar5 = &parent->expiry_time;
        }
      }
      _Var1 = pnVar5->tv_sec;
      _Var2 = pnVar5->tv_nsec;
      nVar6.tv_nsec = _Var2;
      nVar6.tv_sec = _Var1;
      iVar3 = nsync_time_cmp(nVar6,abs_deadline);
      if (iVar3 < 0) {
        (n->expiry_time).tv_sec = _Var1;
        (n->expiry_time).tv_nsec = _Var2;
        n->expiry_time_valid = 1;
      }
      a.tv_nsec = _Var2;
      a.tv_sec = _Var1;
      iVar3 = nsync_time_cmp(a,(nsync_time)ZEXT816((ulong)0));
      if (0 < iVar3) {
        n->parent = parent;
        pnVar4 = nsync_dll_make_last_in_list_(parent->children,(nsync_dll_element_ *)n);
        parent->children = pnVar4;
      }
      nsync_mu_unlock(&parent->note_mu);
      return n;
    }
    return n;
  }
  return n;
}

Assistant:

nsync_note nsync_note_new (nsync_note parent,
			   nsync_time abs_deadline) {
	nsync_note n = (nsync_note) malloc (sizeof (*n));
	if (n != NULL) {
		memset ((void *) n, 0, sizeof (*n));
		nsync_dll_init_ (&n->parent_child_link, n);
		set_expiry_time (n, abs_deadline);
		if (!nsync_note_is_notified (n) && parent != NULL) {
			nsync_time parent_time;
			nsync_mu_lock (&parent->note_mu);
			parent_time = NOTIFIED_TIME (parent);
			if (nsync_time_cmp (parent_time, abs_deadline) < 0) {
				set_expiry_time (n, parent_time);
			}
			if (nsync_time_cmp (parent_time, nsync_time_zero) > 0) {
				n->parent = parent;
				parent->children = nsync_dll_make_last_in_list_ (parent->children,
					&n->parent_child_link);
			}
			nsync_mu_unlock (&parent->note_mu);
		}
	}
	return (n);
}